

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int u32_to_u8(uint32_t *in,int in_len,uint8_t *out,int order)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = 0;
  if (out != (uint8_t *)0x0 && in != (uint32_t *)0x0) {
    uVar4 = 0;
    if (0 < in_len) {
      uVar4 = (ulong)(uint)in_len;
    }
    if (order == 1) {
      iVar2 = 1;
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        *(uint32_t *)(out + uVar3 * 4) = in[uVar3];
      }
    }
    else {
      iVar2 = 1;
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        uVar1 = in[uVar3];
        *(uint *)(out + uVar3 * 4) =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      }
    }
  }
  return iVar2;
}

Assistant:

int u32_to_u8(const uint32_t *in, int in_len, uint8_t *out, int order)
{
    if (in == NULL || out == NULL)
        return GML_ERROR;

    if (order == ENDIANESS) {
        for (int i = 0; i < in_len; i++) {
            *(uint32_t*)out = in[i];
            out += 4;
        }
    }
    else {
        for (int i = 0; i < in_len; i++) {
            *(uint32_t*)out = BSWAP4(in[i]);
            out += 4;
        }
    }

    return GML_OK;
}